

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# highbd_fwd_txfm_avx2.c
# Opt level: O0

void idtx8_avx2(__m256i *in,__m256i *out,int8_t bit,int col_num,int outstride)

{
  undefined1 auVar1 [32];
  int in_ECX;
  long in_RSI;
  long in_RDI;
  int i;
  int num_iters;
  undefined4 local_264;
  
  for (local_264 = 0; local_264 < in_ECX << 3; local_264 = local_264 + 8) {
    auVar1 = vpaddd_avx2(*(undefined1 (*) [32])(in_RDI + (long)local_264 * 0x20),
                         *(undefined1 (*) [32])(in_RDI + (long)local_264 * 0x20));
    *(undefined1 (*) [32])(in_RSI + (long)local_264 * 0x20) = auVar1;
    auVar1 = vpaddd_avx2(*(undefined1 (*) [32])(in_RDI + (long)(local_264 + 1) * 0x20),
                         *(undefined1 (*) [32])(in_RDI + (long)(local_264 + 1) * 0x20));
    *(undefined1 (*) [32])(in_RSI + (long)(local_264 + 1) * 0x20) = auVar1;
    auVar1 = vpaddd_avx2(*(undefined1 (*) [32])(in_RDI + (long)(local_264 + 2) * 0x20),
                         *(undefined1 (*) [32])(in_RDI + (long)(local_264 + 2) * 0x20));
    *(undefined1 (*) [32])(in_RSI + (long)(local_264 + 2) * 0x20) = auVar1;
    auVar1 = vpaddd_avx2(*(undefined1 (*) [32])(in_RDI + (long)(local_264 + 3) * 0x20),
                         *(undefined1 (*) [32])(in_RDI + (long)(local_264 + 3) * 0x20));
    *(undefined1 (*) [32])(in_RSI + (long)(local_264 + 3) * 0x20) = auVar1;
    auVar1 = vpaddd_avx2(*(undefined1 (*) [32])(in_RDI + (long)(local_264 + 4) * 0x20),
                         *(undefined1 (*) [32])(in_RDI + (long)(local_264 + 4) * 0x20));
    *(undefined1 (*) [32])(in_RSI + (long)(local_264 + 4) * 0x20) = auVar1;
    auVar1 = vpaddd_avx2(*(undefined1 (*) [32])(in_RDI + (long)(local_264 + 5) * 0x20),
                         *(undefined1 (*) [32])(in_RDI + (long)(local_264 + 5) * 0x20));
    *(undefined1 (*) [32])(in_RSI + (long)(local_264 + 5) * 0x20) = auVar1;
    auVar1 = vpaddd_avx2(*(undefined1 (*) [32])(in_RDI + (long)(local_264 + 6) * 0x20),
                         *(undefined1 (*) [32])(in_RDI + (long)(local_264 + 6) * 0x20));
    *(undefined1 (*) [32])(in_RSI + (long)(local_264 + 6) * 0x20) = auVar1;
    auVar1 = vpaddd_avx2(*(undefined1 (*) [32])(in_RDI + (long)(local_264 + 7) * 0x20),
                         *(undefined1 (*) [32])(in_RDI + (long)(local_264 + 7) * 0x20));
    *(undefined1 (*) [32])(in_RSI + (long)(local_264 + 7) * 0x20) = auVar1;
  }
  return;
}

Assistant:

static void idtx8_avx2(__m256i *in, __m256i *out, const int8_t bit, int col_num,
                       int outstride) {
  (void)bit;
  (void)outstride;
  int num_iters = 8 * col_num;
  for (int i = 0; i < num_iters; i += 8) {
    out[i] = _mm256_add_epi32(in[i], in[i]);
    out[i + 1] = _mm256_add_epi32(in[i + 1], in[i + 1]);
    out[i + 2] = _mm256_add_epi32(in[i + 2], in[i + 2]);
    out[i + 3] = _mm256_add_epi32(in[i + 3], in[i + 3]);
    out[i + 4] = _mm256_add_epi32(in[i + 4], in[i + 4]);
    out[i + 5] = _mm256_add_epi32(in[i + 5], in[i + 5]);
    out[i + 6] = _mm256_add_epi32(in[i + 6], in[i + 6]);
    out[i + 7] = _mm256_add_epi32(in[i + 7], in[i + 7]);
  }
}